

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

void icu_63::cacheInit(UErrorCode *status)

{
  UBool UVar1;
  UnifiedCache *this;
  code *size;
  UnifiedCache *local_30;
  UErrorCode *status_local;
  
  size = unifiedcache_cleanup;
  ucln_common_registerCleanup_63(UCLN_COMMON_UNIFIED_CACHE,unifiedcache_cleanup);
  this = (UnifiedCache *)UMemory::operator_new((UMemory *)0x38,(size_t)size);
  local_30 = (UnifiedCache *)0x0;
  if (this != (UnifiedCache *)0x0) {
    UnifiedCache::UnifiedCache(this,status);
    local_30 = this;
  }
  gCache = local_30;
  if (local_30 == (UnifiedCache *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    if (gCache != (UnifiedCache *)0x0) {
      (*(gCache->super_UnifiedCacheBase).super_UObject._vptr_UObject[1])();
    }
    gCache = (UnifiedCache *)0x0;
  }
  return;
}

Assistant:

static void U_CALLCONV cacheInit(UErrorCode &status) {
    U_ASSERT(gCache == NULL);
    ucln_common_registerCleanup(
            UCLN_COMMON_UNIFIED_CACHE, unifiedcache_cleanup);

    gCache = new UnifiedCache(status);
    if (gCache == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    if (U_FAILURE(status)) {
        delete gCache;
        gCache = NULL;
        return;
    }
}